

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_mthc0_entrylo(TCGContext_conflict6 *tcg_ctx,TCGv_i64 arg,target_ulong off)

{
  TCGv_i64 ret;
  TCGv_i64 ret_00;
  uintptr_t o;
  uintptr_t o_1;
  
  ret = tcg_temp_new_i64(tcg_ctx);
  ret_00 = tcg_temp_new_i64(tcg_ctx);
  tcg_gen_mov_i64_mips64el(tcg_ctx,ret,arg);
  tcg_gen_ld_i64_mips64el(tcg_ctx,ret_00,tcg_ctx->cpu_env,off);
  tcg_gen_deposit_i64_mips64el(tcg_ctx,ret_00,ret_00,ret,0x1e,0x20);
  tcg_gen_st_i64_mips64el(tcg_ctx,ret_00,tcg_ctx->cpu_env,off);
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
  tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
  return;
}

Assistant:

static inline void gen_mthc0_entrylo(TCGContext *tcg_ctx, TCGv arg, target_ulong off)
{
    TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
    TCGv_i64 t1 = tcg_temp_new_i64(tcg_ctx);

    tcg_gen_ext_tl_i64(tcg_ctx, t0, arg);
    tcg_gen_ld_i64(tcg_ctx, t1, tcg_ctx->cpu_env, off);
#if defined(TARGET_MIPS64)
    tcg_gen_deposit_i64(tcg_ctx, t1, t1, t0, 30, 32);
#else
    tcg_gen_concat32_i64(tcg_ctx, t1, t1, t0);
#endif
    tcg_gen_st_i64(tcg_ctx, t1, tcg_ctx->cpu_env, off);
    tcg_temp_free_i64(tcg_ctx, t1);
    tcg_temp_free_i64(tcg_ctx, t0);
}